

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

uint16_t __thiscall create::Packet::getData(Packet *this)

{
  uint16_t uVar1;
  
  std::mutex::lock(&this->dataMutex);
  uVar1 = this->data;
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataMutex);
  return uVar1;
}

Assistant:

uint16_t Packet::getData() const {
    std::lock_guard<std::mutex> lock(dataMutex);
    return data;
  }